

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_vector.c
# Opt level: O3

void vector_push_back_empty(vector v)

{
  int iVar1;
  size_t sVar2;
  
  if (v != (vector)0x0) {
    sVar2 = v->size;
    if (sVar2 == v->capacity) {
      iVar1 = vector_reserve(v,sVar2 * 2);
      if (iVar1 != 0) {
        log_write_impl_va("metacall",0x120,"vector_push_back_empty",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_vector.c"
                          ,LOG_LEVEL_ERROR,"Vector reserve error");
        return;
      }
      sVar2 = v->size;
    }
    v->size = sVar2 + 1;
  }
  return;
}

Assistant:

void vector_push_back_empty(vector v)
{
	if (v != NULL)
	{
		if (v->size == v->capacity)
		{
			if (vector_reserve(v, v->capacity * VECTOR_CAPACITY_INCREMENT) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Vector reserve error");

				return;
			}
		}

		++v->size;
	}
}